

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

ostream * __thiscall smf::Options::printRegister(Options *this,ostream *out)

{
  pointer ppOVar1;
  Option_register **item;
  pointer ppOVar2;
  
  ppOVar1 = (this->m_optionRegister).
            super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppOVar2 = (this->m_optionRegister).
                 super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppOVar2 != ppOVar1;
      ppOVar2 = ppOVar2 + 1) {
    Option_register::print(*ppOVar2,out);
  }
  return out;
}

Assistant:

std::ostream& Options::printRegister(std::ostream& out) {
	for (auto &item : m_optionRegister) {
		item->print(out);
	}
	return out;
}